

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O2

_Bool Hacl_P256_compressed_to_raw(uint8_t *pk,uint8_t *pk_raw)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint64_t uVar6;
  int iVar7;
  bool bVar8;
  uint64_t ya [4];
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uint64_t y2M [4];
  uint64_t yM [4];
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  uint64_t local_98;
  uint64_t uStack_90;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78 [4];
  uint64_t xM [4];
  
  ya[2] = 0;
  ya[3] = 0;
  ya[0] = 0;
  ya[1] = 0;
  bVar1 = *pk;
  if ((bVar1 & 0xfe) == 2) {
    uVar2 = *(ulong *)(pk + 0x19);
    local_118 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
    uVar2 = *(ulong *)(pk + 0x11);
    local_110 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
    uVar2 = *(ulong *)(pk + 9);
    local_108 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
    uVar2 = *(ulong *)(pk + 1);
    local_100 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
    if (local_100 < 0xffffffff00000001 ||
        local_100 + 0xffffffff <
        (ulong)(local_108 <
               (local_110 < 0xffffffff ||
               local_110 - 0xffffffff < (ulong)(local_118 != 0xffffffffffffffff)))) {
      y2M[2] = 0;
      y2M[3] = 0;
      y2M[0] = 0;
      y2M[1] = 0;
      xM[2] = 0;
      xM[3] = 0;
      xM[0] = 0;
      xM[1] = 0;
      yM[2] = 0;
      yM[3] = 0;
      yM[0] = 0;
      yM[1] = 0;
      to_mont(xM,&local_118);
      fcube(y2M,xM);
      local_78[0] = 0xfffffffffffffffc;
      local_78[1] = 0x3ffffffff;
      local_78[2] = 0;
      local_78[3] = 0xfffffffc00000004;
      fmul0(local_78,local_78,xM);
      fadd0(y2M,local_78,y2M);
      local_78[0] = 0xd89cdf6229c4bddf;
      local_78[1] = 0xacf005cd78843090;
      local_78[2] = 0xe5a220abf7212ed6;
      local_78[3] = 0xdc30061d04874834;
      fadd0(y2M,local_78,y2M);
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_b8 = y2M[0];
      uStack_b0 = y2M[1];
      local_a8 = y2M[2];
      uStack_a0 = y2M[3];
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,y2M);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fmul0(&local_98,&local_98,&local_b8);
      local_a8 = local_88;
      uStack_a0 = uStack_80;
      local_b8 = local_98;
      uStack_b0 = uStack_90;
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,&local_98);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fsqr0(&local_98,&local_98);
      fmul0(&local_98,&local_98,&local_b8);
      local_a8 = local_88;
      uStack_a0 = uStack_80;
      local_b8 = local_98;
      uStack_b0 = uStack_90;
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fsqr0(&local_b8,&local_b8);
      fmul0(&local_b8,&local_b8,&local_98);
      local_88 = local_a8;
      uStack_80 = uStack_a0;
      local_98 = local_b8;
      uStack_90 = uStack_b0;
      iVar7 = 0x20;
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
        fsqr0(&local_98,&local_98);
      }
      fmul0(&local_98,&local_98,y2M);
      iVar7 = 0x60;
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
        fsqr0(&local_98,&local_98);
      }
      fmul0(&local_98,&local_98,y2M);
      iVar7 = 0x5e;
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
        fsqr0(&local_98,&local_98);
      }
      yM[2] = local_88;
      yM[3] = uStack_80;
      yM[0] = local_98;
      yM[1] = uStack_90;
      from_mont(ya,yM);
      fsqr0(yM,yM);
      uVar6 = bn_is_eq_mask4(yM,y2M);
      if (uVar6 == 0xffffffffffffffff) {
        local_a8 = 0;
        uStack_a0 = 0;
        local_b8 = 0;
        uStack_b0 = 0;
        if ((bVar1 == 3) != (bool)((byte)ya[0] & 1)) {
          fsub0(ya,&local_b8,ya);
        }
        uVar3 = *(undefined8 *)(pk + 1);
        uVar4 = *(undefined8 *)(pk + 9);
        uVar5 = *(undefined8 *)(pk + 0x19);
        *(undefined8 *)(pk_raw + 0x10) = *(undefined8 *)(pk + 0x11);
        *(undefined8 *)(pk_raw + 0x18) = uVar5;
        *(undefined8 *)pk_raw = uVar3;
        *(undefined8 *)(pk_raw + 8) = uVar4;
        *(uint64_t *)(pk_raw + 0x20) =
             ya[3] >> 0x38 | (ya[3] & 0xff000000000000) >> 0x28 | (ya[3] & 0xff0000000000) >> 0x18 |
             (ya[3] & 0xff00000000) >> 8 | (ya[3] & 0xff000000) << 8 | (ya[3] & 0xff0000) << 0x18 |
             (ya[3] & 0xff00) << 0x28 | ya[3] << 0x38;
        *(uint64_t *)(pk_raw + 0x28) =
             ya[2] >> 0x38 | (ya[2] & 0xff000000000000) >> 0x28 | (ya[2] & 0xff0000000000) >> 0x18 |
             (ya[2] & 0xff00000000) >> 8 | (ya[2] & 0xff000000) << 8 | (ya[2] & 0xff0000) << 0x18 |
             (ya[2] & 0xff00) << 0x28 | ya[2] << 0x38;
        *(uint64_t *)(pk_raw + 0x30) =
             ya[1] >> 0x38 | (ya[1] & 0xff000000000000) >> 0x28 | (ya[1] & 0xff0000000000) >> 0x18 |
             (ya[1] & 0xff00000000) >> 8 | (ya[1] & 0xff000000) << 8 | (ya[1] & 0xff0000) << 0x18 |
             (ya[1] & 0xff00) << 0x28 | ya[1] << 0x38;
        *(uint64_t *)(pk_raw + 0x38) =
             ya[0] >> 0x38 | (ya[0] & 0xff000000000000) >> 0x28 | (ya[0] & 0xff0000000000) >> 0x18 |
             (ya[0] & 0xff00000000) >> 8 | (ya[0] & 0xff000000) << 8 | (ya[0] & 0xff0000) << 0x18 |
             (ya[0] & 0xff00) << 0x28 | ya[0] << 0x38;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Hacl_P256_compressed_to_raw(uint8_t *pk, uint8_t *pk_raw)
{
  uint64_t xa[4U] = { 0U };
  uint64_t ya[4U] = { 0U };
  uint8_t *pk_xb = pk + 1U;
  bool b = aff_point_decompress_vartime(xa, ya, pk);
  if (b)
  {
    memcpy(pk_raw, pk_xb, 32U * sizeof (uint8_t));
    bn_to_bytes_be4(pk_raw + 32U, ya);
  }
  return b;
}